

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O1

TestSuite * cpp_assertion_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("cpp_assertion_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
                      ,0xc9);
  set_setup(pTVar1,setup);
  set_teardown(pTVar1,teardown);
  add_test_(pTVar1,"custom_large_classes_are_equal",
            &CgreenSpec__default__custom_large_classes_are_equal__);
  add_test_(pTVar1,"custom_large_classes_are_not_equal",
            &CgreenSpec__default__custom_large_classes_are_not_equal__);
  add_test_(pTVar1,"same_stl_string_references_are_equal",
            &CgreenSpec__default__same_stl_string_references_are_equal__);
  add_test_(pTVar1,"stl_string_contains_string",&CgreenSpec__default__stl_string_contains_string__);
  add_test_(pTVar1,"string_contains_stl_string",&CgreenSpec__default__string_contains_stl_string__);
  add_test_(pTVar1,"string_contains_stl_string_pointer",
            &CgreenSpec__default__string_contains_stl_string_pointer__);
  add_test_(pTVar1,"stl_string_does_not_contain_string",
            &CgreenSpec__default__stl_string_does_not_contain_string__);
  add_test_(pTVar1,"string_does_not_contain_stl_string",
            &CgreenSpec__default__string_does_not_contain_stl_string__);
  add_test_(pTVar1,"string_does_not_contain_stl_string_pointer",
            &CgreenSpec__default__string_does_not_contain_stl_string_pointer__);
  add_test_(pTVar1,"stl_string_begins_with_string",
            &CgreenSpec__default__stl_string_begins_with_string__);
  add_test_(pTVar1,"string_begins_with_stl_string",
            &CgreenSpec__default__string_begins_with_stl_string__);
  add_test_(pTVar1,"string_begins_with_stl_string_pointer",
            &CgreenSpec__default__string_begins_with_stl_string_pointer__);
  add_test_(pTVar1,"different_stl_string_references_are_not_equal",
            &CgreenSpec__default__different_stl_string_references_are_not_equal__);
  add_test_(pTVar1,"different_stl_string_pointers_are_not_equal",
            &CgreenSpec__default__different_stl_string_pointers_are_not_equal__);
  add_test_(pTVar1,"different_stl_string_pointer_and_reference_are_not_equal",
            &CgreenSpec__default__different_stl_string_pointer_and_reference_are_not_equal__);
  add_test_(pTVar1,"different_stl_string_reference_and_pointer_are_not_equal",
            &CgreenSpec__default__different_stl_string_reference_and_pointer_are_not_equal__);
  add_test_(pTVar1,"same_stl_string_pointer_and_reference_are_equal",
            &CgreenSpec__default__same_stl_string_pointer_and_reference_are_equal__);
  add_test_(pTVar1,"same_stl_string_reference_and_pointer_are_equal",
            &CgreenSpec__default__same_stl_string_reference_and_pointer_are_equal__);
  add_test_(pTVar1,"stl_string_pointer_is_not_null",
            &CgreenSpec__default__stl_string_pointer_is_not_null__);
  add_test_(pTVar1,"stl_string_pointer_is_null",&CgreenSpec__default__stl_string_pointer_is_null__);
  add_test_(pTVar1,"stl_string_length_assertion_failure_is_readable",
            &CgreenSpec__default__stl_string_length_assertion_failure_is_readable__);
  add_test_(pTVar1,"std_exception_what_is_output",
            &CgreenSpec__default__std_exception_what_is_output__);
  add_test_(pTVar1,"assert_throws_macro_passes_basic_type",
            &CgreenSpec__default__assert_throws_macro_passes_basic_type__);
  add_test_(pTVar1,"assert_throws_macro_passes_pointer_type",
            &CgreenSpec__default__assert_throws_macro_passes_pointer_type__);
  return pTVar1;
}

Assistant:

TestSuite* cpp_assertion_tests() {
    TestSuite *suite = create_test_suite();
    set_setup(suite, setup);
    set_teardown(suite, teardown);
    add_test(suite, custom_large_classes_are_equal);
    add_test(suite, custom_large_classes_are_not_equal);
    add_test(suite, same_stl_string_references_are_equal);
    add_test(suite, stl_string_contains_string);
    add_test(suite, string_contains_stl_string);
    add_test(suite, string_contains_stl_string_pointer);
    add_test(suite, stl_string_does_not_contain_string);
    add_test(suite, string_does_not_contain_stl_string);
    add_test(suite, string_does_not_contain_stl_string_pointer);
    add_test(suite, stl_string_begins_with_string);
    add_test(suite, string_begins_with_stl_string);
    add_test(suite, string_begins_with_stl_string_pointer);
    add_test(suite, different_stl_string_references_are_not_equal);
    add_test(suite, different_stl_string_pointers_are_not_equal);
    add_test(suite, different_stl_string_pointer_and_reference_are_not_equal);
    add_test(suite, different_stl_string_reference_and_pointer_are_not_equal);
    add_test(suite, same_stl_string_pointer_and_reference_are_equal);
    add_test(suite, same_stl_string_reference_and_pointer_are_equal);
    add_test(suite, stl_string_pointer_is_not_null);
    add_test(suite, stl_string_pointer_is_null);
    add_test(suite, stl_string_length_assertion_failure_is_readable);
    add_test(suite, std_exception_what_is_output);
    add_test(suite, assert_throws_macro_passes_basic_type);
    add_test(suite, assert_throws_macro_passes_pointer_type);
    return suite;
}